

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeGlobalSet(TranslateToFuzzReader *this,Type type)

{
  Name name_00;
  undefined1 auVar1 [8];
  size_t sVar2;
  bool bVar3;
  pointer ppVar4;
  value_type *pvVar5;
  Expression *value;
  bool local_79;
  undefined1 local_58 [8];
  value_type name;
  _Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
  local_38;
  iterator it;
  BasicType local_24;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_24 = none;
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar3 = Type::operator==((Type *)&this_local,&local_24);
  if (!bVar3) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xae5,"Expression *wasm::TranslateToFuzzReader::makeGlobalSet(Type)");
  }
  it.
  super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
             )getConcreteType(this);
  this_local = (TranslateToFuzzReader *)
               it.
               super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
               ._M_cur;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
       ::find(&this->mutableGlobalsByType,(key_type *)&this_local);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
       ::end(&this->mutableGlobalsByType);
  bVar3 = std::__detail::operator==(&local_38,&local_40);
  local_79 = true;
  if (!bVar3) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
                           *)&local_38);
    local_79 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::empty(&ppVar4->second);
  }
  if (local_79 == false) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
                           *)&local_38);
    pvVar5 = pick<std::vector<wasm::Name,std::allocator<wasm::Name>>>(this,&ppVar4->second);
    local_58 = (undefined1  [8])(pvVar5->super_IString).str._M_len;
    name.super_IString.str._M_len = (size_t)(pvVar5->super_IString).str._M_str;
    bVar3 = IString::operator!=((IString *)local_58,&(this->HANG_LIMIT_GLOBAL).super_IString);
    sVar2 = name.super_IString.str._M_len;
    auVar1 = local_58;
    if (!bVar3) {
      __assert_fail("name != HANG_LIMIT_GLOBAL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xaee,"Expression *wasm::TranslateToFuzzReader::makeGlobalSet(Type)");
    }
    value = make(this,(Type)this_local);
    name_00.super_IString.str._M_str = (char *)sVar2;
    name_00.super_IString.str._M_len = (size_t)auVar1;
    type_local.id = (uintptr_t)Builder::makeGlobalSet(&this->builder,name_00,value);
  }
  else {
    Type::Type((Type *)&name.super_IString.str._M_str,none);
    type_local.id = (uintptr_t)makeTrivial(this,(Type)name.super_IString.str._M_str);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeGlobalSet(Type type) {
  assert(type == Type::none);
  type = getConcreteType();
  auto it = mutableGlobalsByType.find(type);
  if (it == mutableGlobalsByType.end() || it->second.empty()) {
    return makeTrivial(Type::none);
  }

  auto name = pick(it->second);
  // We don't want random fuzz code to use the hang limit global.
  assert(name != HANG_LIMIT_GLOBAL);
  return builder.makeGlobalSet(name, make(type));
}